

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O1

void fsnav_ins_motion_vertical_damping(void)

{
  char cVar1;
  fsnav_imu *pfVar2;
  fsnav_air *pfVar3;
  char *__nptr;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double y [2];
  double S [3];
  double K [2];
  double h [2];
  char vvs_token [23];
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78 [2];
  double local_68;
  double local_60;
  char local_58 [32];
  double local_38;
  undefined8 uStack_30;
  
  builtin_strncpy(local_58,"vertical_damping_stdev",0x17);
  pfVar2 = fsnav->imu;
  if (pfVar2 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_motion_vertical_damping::t0 = -1.0;
      __nptr = fsnav_locate_token(local_58,pfVar2->cfg,pfVar2->cfglength,'=');
      if (__nptr == (char *)0x0) {
        fsnav_ins_motion_vertical_damping::vvs = 1048576.0;
      }
      else {
        fsnav_ins_motion_vertical_damping::vvs = atof(__nptr);
      }
      if (fsnav_ins_motion_vertical_damping::vvs < 0.0) {
        fsnav_ins_motion_vertical_damping::vvs = 1048576.0;
      }
    }
    else if (-1 < fsnav->mode) {
      dVar5 = pfVar2->t;
      if (0.0 <= fsnav_ins_motion_vertical_damping::t0) {
        local_a8 = dVar5 - fsnav_ins_motion_vertical_damping::t0;
        fsnav_ins_motion_vertical_damping::t0 = dVar5;
        if (0.0 < local_a8) {
          dVar7 = 0.0;
          local_b8 = 0.0;
          if ((pfVar2->sol).llh_valid != '\0') {
            local_b8 = (pfVar2->sol).llh[2];
          }
          cVar1 = (pfVar2->sol).v_valid;
          if (cVar1 != '\0') {
            dVar7 = (pfVar2->sol).v[2];
          }
          local_98 = local_a8 * 1048576.0;
          local_90 = 0.0;
          local_88 = 1.0;
          uStack_a0 = 0;
          local_b0 = dVar7;
          local_80 = local_b8;
          if (cVar1 != '\0') {
            local_68 = 0.0;
            local_60 = 1.0;
            fsnav_linal_kalman_update
                      (&local_b8,&local_98,local_78,0.0,&local_68,
                       fsnav_ins_motion_vertical_damping::vvs,2);
          }
          pfVar3 = fsnav->air;
          if (pfVar3 != (fsnav_air *)0x0) {
            if ((pfVar3->alt_valid != '\0') && ((fsnav->imu->sol).llh_valid != '\0')) {
              uVar4 = -(ulong)(0.0 < pfVar3->alt_std);
              local_38 = (double)(~uVar4 & (ulong)fsnav_ins_motion_vertical_damping::vvs |
                                 (ulong)pfVar3->alt_std & uVar4) * 1.4142135623730951;
              uStack_30 = 0;
              local_68 = 2.0;
              local_60 = -local_a8;
              fsnav_linal_kalman_update
                        (&local_b8,&local_98,local_78,
                         pfVar3->alt + fsnav_ins_motion_vertical_damping::air_alt_last,&local_68,
                         local_38,2);
              local_68 = 0.0;
              local_60 = local_a8;
              fsnav_linal_kalman_update
                        (&local_b8,&local_98,local_78,
                         fsnav->air->alt - fsnav_ins_motion_vertical_damping::air_alt_last,&local_68
                         ,local_38,2);
              fsnav_ins_motion_vertical_damping::air_alt_last = fsnav->air->alt;
            }
            pfVar3 = fsnav->air;
            if ((pfVar3->vv_valid != '\0') && ((fsnav->imu->sol).v_valid != '\0')) {
              uVar4 = -(ulong)(0.0 < pfVar3->vv_std);
              fsnav_linal_kalman_update
                        (&local_b8,&local_98,local_78,pfVar3->vv - (fsnav->imu->sol).v[2],&local_68,
                         (double)(~uVar4 & (ulong)fsnav_ins_motion_vertical_damping::vvs |
                                 (ulong)pfVar3->vv_std & uVar4),2);
            }
          }
          dVar5 = local_98 * local_98 + local_90 * local_90;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          pfVar2 = fsnav->imu;
          cVar1 = (pfVar2->sol).llh_valid;
          if (cVar1 != '\0') {
            (pfVar2->sol).llh[2] = local_b8;
          }
          dVar6 = local_88 * local_a8 + dVar5;
          if ((pfVar2->sol).v_valid != '\0') {
            (pfVar2->sol).llh[2] =
                 (local_b0 - dVar7) * ((dVar5 + dVar5) / dVar6) * local_a8 + (pfVar2->sol).llh[2];
            (pfVar2->sol).v[2] = local_b0;
          }
          if (cVar1 != '\0') {
            (pfVar2->sol).v[2] =
                 ((local_b8 - local_80) * (((local_88 + local_88) * local_a8) / dVar6)) / local_a8 +
                 (pfVar2->sol).v[2];
          }
        }
      }
      else {
        pfVar3 = fsnav->air;
        fsnav_ins_motion_vertical_damping::t0 = dVar5;
        if ((pfVar3 != (fsnav_air *)0x0) && (pfVar3->alt_valid != '\0')) {
          fsnav_ins_motion_vertical_damping::air_alt_last = pfVar3->alt;
        }
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_motion_vertical_damping(void) {

	const char vvs_token[] = "vertical_damping_stdev"; // vertical velocity stdev parameter name in configuration

	const double 
		vvs_def = (double)(0x100000),                  // 2^20, vertical velocity stdev default value
		sqrt2   = 1.4142135623730951;                  // sqrt(2)

	static double 
		t0           = -1, // previous time
		vvs          =  0, // vertical velocity stdev
		air_alt_last =  0; // previous value of air altitude

	double 
		dt,	  // time step
		x,    // inertial altitude
		v,    // inertial vertical velocity
		z,    // reference information
		s,    // reference information a priori stdev
		h[2], // model coefficients
		y[2], // algorithm state vector
		S[3], // upper-triangular part of cobariance Cholesky factorization
		K[2], // Kalman gain
		w;    // weight


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// reset time
		t0 = -1;
		// parse vertical velocity stdev from configuration string
		vvs = fsnav_ins_motion_parse_double(vvs_token, fsnav->imu->cfg, fsnav->imu->cfglength, NULL, vvs_def);
		if (vvs < 0)
			vvs = vvs_def;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}
	else						// main cycle
	{
		// time variables
		if (t0 < 0) {
			t0 = fsnav->imu->t;
			if (fsnav->air != NULL && fsnav->air->alt_valid)
				air_alt_last = fsnav->air->alt;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		if (dt <= 0)
			return;
		// estimation init 
		if (fsnav->imu->sol.llh_valid) x = fsnav->imu->sol.llh[2]; else x = 0;
		if (fsnav->imu->sol.  v_valid) v = fsnav->imu->sol.  v[2]; else v = 0;
		y[0] = x, y[1] = v;
		S[0] = vvs_def*dt, S[1] = 0, S[2] = 1;
		// zero vertical velocity
		if (fsnav->imu->sol.v_valid) {
			s = vvs;
			z = 0.0;
			h[0] = 0, h[1] = 1;
			fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
		}
		// check for air data
		if (fsnav->air != NULL) {
			if (fsnav->air->alt_valid && fsnav->imu->sol.llh_valid) { // altitude data present
				// altitude
				s = sqrt2*( (fsnav->air->alt_std > 0) ? (fsnav->air->alt_std) : vvs );
				z = fsnav->air->alt + air_alt_last; // decorrelated with velocity information
				h[0] = 2, h[1] = -dt;
				fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
				// altitude rate of change
				z = fsnav->air->alt - air_alt_last; // decorrelated with altitude information
				h[0] = 0, h[1] = dt;
				fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
				air_alt_last = fsnav->air->alt;
			}
			if (fsnav->air->vv_valid && fsnav->imu->sol.v_valid) { // vertical velocity data present
				z = fsnav->air->vv - fsnav->imu->sol.v[2];
				s = (fsnav->air-> vv_std > 0) ? (fsnav->air-> vv_std) : vvs;
				fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
			}
		}

		// check for gnss data
		//
		// TBD
		//

		// vertical channel correction
		s = sqrt(S[0]*S[0] + S[1]*S[1]);  // altitude stdev estimate
		w = s + S[2]*dt;                  // sum of altitude stdev and velocity contribution into stdev
		if (fsnav->imu->sol.llh_valid) 
			fsnav->imu->sol.llh[2] = y[0]; // replace altitude by its estimated value
		if (fsnav->imu->sol.  v_valid) {
			fsnav->imu->sol.llh[2] += 2*s      /w*(y[1]-v)*dt; // weighted correction to hold dx/dt = v
			fsnav->imu->sol.  v[2] = y[1]; // replace vertical velocity by its estimated value
		}
		if (fsnav->imu->sol.llh_valid) 
			fsnav->imu->sol.  v[2] += 2*S[2]*dt/w*(y[0]-x)/dt; // weighted correction to hold dx/dt = v

	}

}